

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_meth.c
# Opt level: O0

void * get_encoder_from_store(void *store,OSSL_PROVIDER **prov,void *data)

{
  char *__s;
  OSSL_NAMEMAP *pOVar1;
  char *pcVar2;
  OSSL_NAMEMAP *namemap_00;
  OSSL_METHOD_STORE *pOVar3;
  long in_RDX;
  long in_RDI;
  OSSL_PROVIDER **unaff_retaddr;
  char *in_stack_00000008;
  size_t l;
  char *q;
  char *names;
  OSSL_NAMEMAP *namemap;
  int id;
  void *method;
  encoder_data_st *methdata;
  size_t in_stack_ffffffffffffff98;
  OSSL_LIB_CTX *in_stack_ffffffffffffffa8;
  int local_34;
  void **in_stack_fffffffffffffff8;
  
  local_34 = *(int *)(in_RDX + 8);
  if ((local_34 == 0) && (*(long *)(in_RDX + 0x10) != 0)) {
    pOVar1 = ossl_namemap_stored(in_stack_ffffffffffffffa8);
    __s = *(char **)(in_RDX + 0x10);
    pcVar2 = strchr(__s,0x3a);
    if (pcVar2 == (char *)0x0) {
      namemap_00 = (OSSL_NAMEMAP *)strlen(__s);
    }
    else {
      namemap_00 = (OSSL_NAMEMAP *)(pcVar2 + -(long)__s);
    }
    if (pOVar1 == (OSSL_NAMEMAP *)0x0) {
      return (void *)0x0;
    }
    local_34 = ossl_namemap_name2num_n(namemap_00,(char *)namemap_00,in_stack_ffffffffffffff98);
  }
  if ((local_34 != 0) &&
     ((in_RDI != 0 ||
      (pOVar3 = get_encoder_store((OSSL_LIB_CTX *)0x40ef8d), pOVar3 != (OSSL_METHOD_STORE *)0x0))))
  {
    ossl_method_store_fetch
              ((OSSL_METHOD_STORE *)q,l._4_4_,in_stack_00000008,unaff_retaddr,
               in_stack_fffffffffffffff8);
  }
  return (void *)0x0;
}

Assistant:

static void *get_encoder_from_store(void *store, const OSSL_PROVIDER **prov,
                                    void *data)
{
    struct encoder_data_st *methdata = data;
    void *method = NULL;
    int id;

    /*
     * get_encoder_from_store() is only called to try and get the method
     * that OSSL_ENCODER_fetch() is asking for, and the name or name id are
     * passed via methdata.
     */
    if ((id = methdata->id) == 0 && methdata->names != NULL) {
        OSSL_NAMEMAP *namemap = ossl_namemap_stored(methdata->libctx);
        const char *names = methdata->names;
        const char *q = strchr(names, NAME_SEPARATOR);
        size_t l = (q == NULL ? strlen(names) : (size_t)(q - names));

        if (namemap == 0)
            return NULL;
        id = ossl_namemap_name2num_n(namemap, methdata->names, l);
    }

    if (id == 0)
        return NULL;

    if (store == NULL
        && (store = get_encoder_store(methdata->libctx)) == NULL)
        return NULL;

    if (!ossl_method_store_fetch(store, id, methdata->propquery, prov, &method))
        return NULL;
    return method;
}